

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXingReader.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Type TVar1;
  BarcodeFormat BVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  undefined4 uVar7;
  uint uVar8;
  size_t sVar9;
  long *plVar10;
  ostream *poVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  int *piVar12;
  char *pcVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  PointT<int> this;
  pointer pbVar18;
  int iVar19;
  long in_FS_OFFSET;
  Barcodes merged;
  int channels;
  Barcodes barcodes;
  int height;
  int width;
  CLI cli;
  Barcodes allBarcodes;
  anon_class_16_2_fc49f3d4 is;
  undefined1 local_218 [32];
  uint local_1f8;
  uint local_1f4;
  undefined8 local_1f0;
  undefined1 local_1e8 [40];
  pointer local_1c0;
  SymbologyIdentifier local_1b8;
  uint local_1b4;
  uint local_1b0;
  int iStack_1ac;
  PointT<int> local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  undefined1 local_190 [24];
  PointT<int> local_178;
  PointT<int> local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  long local_158;
  char local_150 [4];
  int local_14c;
  undefined1 local_148 [24];
  string local_130 [8];
  long local_128;
  char local_120 [16];
  uint local_110;
  int iStack_10c;
  char cStack_108;
  char cStack_107;
  undefined1 uStack_106;
  Error *local_100;
  long *local_f8;
  long local_f0;
  long local_e8 [2];
  vector<ZXing::Result,_std::allocator<ZXing::Result>_> local_d8;
  string local_b8;
  long *local_98;
  long local_90;
  long local_88 [2];
  undefined1 local_78 [12];
  int iStack_6c;
  int local_68;
  int local_60;
  pointer local_58;
  ostream *local_50;
  
  local_1f0 = (pointer)0x1f4ff02;
  local_130 = (string  [8])local_120;
  local_148._16_8_ = 0;
  local_148._0_8_ = (pointer)0x0;
  local_148._8_8_ = (pointer)0x0;
  local_128 = 0;
  local_120[0] = '\0';
  local_110 = 0;
  iStack_10c = 0;
  cStack_108 = '\0';
  cStack_107 = '\0';
  uStack_106 = 0;
  local_d8.super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f4 = local_1f4 & 0xc0e08000 | 0x82d2f;
  local_1b0 = 1;
  bVar5 = argc < 2;
  local_1f8 = argc;
  local_1e8._0_8_ = argv;
  local_170 = (PointT<int>)argv;
  if (1 < argc) {
    bVar5 = false;
    do {
      uVar8 = local_1b0;
      pbVar18 = (pointer)local_1e8._0_8_;
      local_78._0_8_ = local_1e8;
      unique0x00004e80 = &local_1b0;
      lVar16 = (long)(int)local_1b0;
      pcVar13 = ((_Alloc_hider *)local_1e8._0_8_)[lVar16]._M_p;
      sVar9 = strlen(pcVar13);
      iVar6 = strncmp(pcVar13,"-fast",sVar9);
      if (iVar6 == 0) {
        local_1f4 = local_1f4 & 0xfffffffe;
      }
      else {
        iVar6 = strncmp(pcVar13,"-norotate",sVar9);
        if (iVar6 == 0) {
          local_1f4 = local_1f4 & 0xfffffffd;
        }
        else {
          iVar6 = strncmp(pcVar13,"-noinvert",sVar9);
          if (iVar6 == 0) {
            local_1f4 = local_1f4 & 0xfffffffb;
          }
          else {
            iVar6 = strncmp(pcVar13,"-noscale",sVar9);
            if (iVar6 == 0) {
              local_1f4 = local_1f4 & 0xfffffff7;
            }
            else {
              iVar6 = strncmp(pcVar13,"-single",sVar9);
              if (iVar6 == 0) {
                local_1f0._0_2_ = CONCAT11(1,(undefined1)local_1f0);
              }
              else {
                iVar6 = strncmp(pcVar13,"-ispure",sVar9);
                if (iVar6 == 0) {
                  local_1f4 = local_1f4 & 0xfffcffef | 0x20010;
                }
                else {
                  iVar6 = strncmp(pcVar13,"-errors",sVar9);
                  if (iVar6 == 0) {
                    local_1f4 = local_1f4 | 0x200;
                  }
                  else {
                    iVar6 = strncmp(pcVar13,"-format",sVar9);
                    if (iVar6 == 0) {
                      local_1b0 = uVar8 + 1;
                      if (local_1b0 == local_1f8) break;
                      pcVar13 = (&pbVar18->_M_dataplus)[(int)local_1b0]._M_p;
                      sVar9 = strlen(pcVar13);
                      uVar7 = ZXing::BarcodeFormatsFromString(sVar9,pcVar13);
                      local_1f0 = (pointer)CONCAT44(uVar7,(undefined4)local_1f0);
                    }
                    else {
                      iVar6 = strncmp(pcVar13,"-binarizer",sVar9);
                      if (iVar6 == 0) {
                        local_1b0 = uVar8 + 1;
                        if (local_1b0 == local_1f8) break;
                        pcVar13 = (&pbVar18->_M_dataplus)[(int)local_1b0]._M_p;
                        sVar9 = strlen(pcVar13);
                        iVar6 = strncmp(pcVar13,"local",sVar9);
                        if (iVar6 == 0) {
                          local_1f4 = local_1f4 & 0xfffcffff;
                        }
                        else {
                          iVar6 = strncmp(pcVar13,"global",sVar9);
                          if (iVar6 == 0) {
                            local_1f4 = local_1f4 & 0xfffcffff | 0x10000;
                          }
                          else {
                            iVar6 = strncmp(pcVar13,"fixed",sVar9);
                            if (iVar6 != 0) break;
                            local_1f4 = local_1f4 & 0xfffcffff | 0x20000;
                          }
                        }
                      }
                      else {
                        iVar6 = strncmp(pcVar13,"-mode",sVar9);
                        if (iVar6 == 0) {
                          local_1b0 = uVar8 + 1;
                          if (local_1b0 == local_1f8) break;
                          pcVar13 = (&pbVar18->_M_dataplus)[(int)local_1b0]._M_p;
                          sVar9 = strlen(pcVar13);
                          iVar6 = strncmp(pcVar13,"plain",sVar9);
                          if (iVar6 == 0) {
                            local_1f4 = local_1f4 & 0xffe3ffff;
                          }
                          else {
                            iVar6 = strncmp(pcVar13,"eci",sVar9);
                            if (iVar6 == 0) {
                              local_1f4 = local_1f4 & 0xffe3ffff | 0x40000;
                            }
                            else {
                              iVar6 = strncmp(pcVar13,"hri",sVar9);
                              if (iVar6 == 0) {
                                local_1f4 = local_1f4 & 0xffe3ffff | 0x80000;
                              }
                              else {
                                bVar3 = ParseOptions::anon_class_16_2_fc49f3d4::operator()
                                                  ((anon_class_16_2_fc49f3d4 *)local_78,"escaped");
                                if (!bVar3) break;
                                local_1f4 = local_1f4 & 0xffe3ffff | 0x100000;
                              }
                            }
                          }
                        }
                        else {
                          iVar6 = strncmp(pcVar13,"-1",sVar9);
                          if (iVar6 == 0) {
                            cStack_108 = '\x01';
                          }
                          else {
                            pcVar13 = (&pbVar18->_M_dataplus)[(int)local_1b0]._M_p;
                            sVar9 = strlen(pcVar13);
                            iVar6 = strncmp(pcVar13,"-bytes",sVar9);
                            if (iVar6 == 0) {
                              cStack_107 = '\x01';
                            }
                            else {
                              iVar6 = strncmp(pcVar13,"-symbol",sVar9);
                              if (iVar6 == 0) {
                                uStack_106 = 1;
                              }
                              else {
                                iVar6 = strncmp(pcVar13,"-pngout",sVar9);
                                if (iVar6 == 0) {
                                  local_1b0 = uVar8 + 1;
                                  if (local_1b0 == local_1f8) break;
                                  std::__cxx11::string::operator=
                                            (local_130,(&pbVar18->_M_dataplus)[(int)local_1b0]._M_p)
                                  ;
                                }
                                else {
                                  iVar6 = strncmp(pcVar13,"-channels",sVar9);
                                  if (iVar6 == 0) {
                                    local_1b0 = uVar8 + 1;
                                    if (local_1b0 == local_1f8) break;
                                    local_110 = atoi((&pbVar18->_M_dataplus)[(int)local_1b0]._M_p);
                                  }
                                  else {
                                    bVar3 = ParseOptions::anon_class_16_2_fc49f3d4::operator()
                                                      ((anon_class_16_2_fc49f3d4 *)local_78,
                                                       "-rotate");
                                    if (bVar3) {
                                      local_1b0 = uVar8 + 1;
                                      if (local_1b0 == local_1f8) break;
                                      iStack_10c = atoi((&pbVar18->_M_dataplus)[(int)local_1b0]._M_p
                                                       );
                                    }
                                    else {
                                      bVar5 = ParseOptions::anon_class_16_2_fc49f3d4::operator()
                                                        ((anon_class_16_2_fc49f3d4 *)local_78,
                                                         "-help");
                                      if ((bVar5) ||
                                         (bVar5 = ParseOptions::anon_class_16_2_fc49f3d4::operator()
                                                            ((anon_class_16_2_fc49f3d4 *)local_78,
                                                             "--help"), bVar5)) goto LAB_0010b202;
                                      bVar5 = ParseOptions::anon_class_16_2_fc49f3d4::operator()
                                                        ((anon_class_16_2_fc49f3d4 *)local_78,
                                                         "-version");
                                      if ((bVar5) ||
                                         (bVar5 = ParseOptions::anon_class_16_2_fc49f3d4::operator()
                                                            ((anon_class_16_2_fc49f3d4 *)local_78,
                                                             "--version"), bVar5)) {
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,"ZXingReader ",0xc);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,"2.2.1",5);
                                        std::operator<<((ostream *)&std::cout,"\n");
                                        goto LAB_0010b20b;
                                      }
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)local_218,
                                                 (&pbVar18->_M_dataplus)[lVar16]._M_p,
                                                 (allocator<char> *)&local_f8);
                                      std::
                                      vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      ::emplace_back<std::__cxx11::string>
                                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                                  *)local_148,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_218);
                                      if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
                                        operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1
                                                       );
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      local_1b0 = local_1b0 + 1;
      bVar5 = (int)local_1f8 <= (int)local_1b0;
    } while ((int)local_1b0 < (int)local_1f8);
  }
  local_58 = (pointer)local_148._8_8_;
  if ((bool)(bVar5 & local_148._0_8_ != local_148._8_8_)) {
    *(uint *)(malloc + *(long *)(std::cout + -0x18)) =
         *(uint *)(malloc + *(long *)(std::cout + -0x18)) | 1;
    local_1b8.code = '\0';
    local_1b8.modifier = '\0';
    local_1b8.eciModifierOffset = '\0';
    local_1b8.aiFlag = None;
    local_1e8._36_4_ = 0;
    pbVar18 = (pointer)local_148._0_8_;
    do {
      local_178 = (PointT<int>)
                  stbi_load((pbVar18->_M_dataplus)._M_p,&local_14c,(int *)local_150,
                            (int *)&local_1b4,local_110);
      local_1c0 = pbVar18;
      if (local_178 == (PointT<int>)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to read image: ",0x16);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(pbVar18->_M_dataplus)._M_p,
                             pbVar18->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," (",2);
        pcVar13 = *(char **)(in_FS_OFFSET + -0x20);
        if (pcVar13 == (char *)0x0) {
          std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
        }
        else {
          sVar9 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar13,sVar9);
        }
        pbVar18 = local_1c0;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,")",1);
        local_1b8.code = -1;
        local_1b8.modifier = -1;
        local_1b8.eciModifierOffset = -1;
        local_1b8.aiFlag = ~None;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
      }
      else {
        uVar8 = local_110;
        if (local_110 == 0) {
          uVar8 = local_1b4;
        }
        local_1b4 = uVar8;
        if (4 < uVar8) {
          std::__throw_out_of_range_fmt
                    ("array::at: __n (which is %zu) >= _Nm (which is %zu)",(long)(int)uVar8,5);
LAB_0010b202:
          PrintUsage((pbVar18->_M_dataplus)._M_p);
LAB_0010b20b:
          exit(0);
        }
        ZXing::ImageView::ImageView
                  ((ImageView *)local_78,(uint8_t *)local_178,local_14c,(int)local_150,
                   *(ImageFormat *)(&DAT_0011d474 + (long)(int)uVar8 * 4),0,0);
        ZXing::ImageView::rotated((ImageView *)local_218,(ImageView *)local_78,iStack_10c);
        ZXing::ReadBarcodes((ImageView *)local_190,(ReaderOptions *)local_218);
        if (local_190._0_8_ == local_190._8_8_) {
          std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::emplace_back<>
                    ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)local_190);
        }
        std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<ZXing::Result*,std::vector<ZXing::Result,std::allocator<ZXing::Result>>>>
                  ((vector<ZXing::Result,std::allocator<ZXing::Result>> *)&local_d8,
                   local_d8.super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>.
                   _M_impl.super__Vector_impl_data._M_finish,local_190._0_8_,local_190._8_8_);
        sVar9 = pbVar18->_M_string_length;
        if ((sVar9 == ((pointer)(local_148._8_8_ + -0x20))->_M_string_length) &&
           ((sVar9 == 0 ||
            (iVar6 = bcmp((pbVar18->_M_dataplus)._M_p,
                          (((pointer)(local_148._8_8_ + -0x20))->_M_dataplus)._M_p,sVar9),
            iVar6 == 0)))) {
          ZXing::MergeStructuredAppendSequences((vector *)local_218);
          std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
          _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<ZXing::Result*,std::vector<ZXing::Result,std::allocator<ZXing::Result>>>>>
                    ((vector<ZXing::Result,std::allocator<ZXing::Result>> *)local_190,
                     local_190._8_8_,local_218._0_8_,local_218._8_8_);
          std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
                    ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)local_218);
        }
        local_170.x = local_190._8_4_;
        local_170.y = local_190._12_4_;
        this = (PointT<int>)local_190._0_8_;
        if (local_190._0_8_ != local_190._8_8_) {
          do {
            if (local_128 != 0) {
              TVar1 = *(Type *)((long)this + 0x62);
              lVar16 = 0xd;
              do {
                drawLine((ImageView *)local_78,*(PointI *)((long)this + lVar16 * 8),
                         (((Position *)((long)this + 0x68))->super_array<ZXing::PointT<int>,_4UL>).
                         _M_elems[(int)lVar16 - 0xcU & 3],TVar1 != None);
                lVar16 = lVar16 + 1;
              } while (lVar16 != 0x11);
            }
            local_1f8 = (uint)*(Type *)((long)this + 0x62);
            if (cStack_107 == '\x01') {
              plVar10 = (long *)ZXing::Result::bytes();
              lVar16 = *plVar10;
              ZXing::Result::bytes();
              std::ostream::write((char *)&std::cout,lVar16);
            }
            else {
              local_100 = (Error *)((long)this + 0x38);
              if (cStack_108 == '\x01') {
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,(local_1c0->_M_dataplus)._M_p,
                                     local_1c0->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
                ZXing::ToString_abi_cxx11_((BarcodeFormat)local_218);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(char *)local_218._0_8_,local_218._8_8_);
                if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
                  operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
                }
                cVar4 = ZXing::Result::isValid();
                if (cVar4 == '\0') {
                  if (*(Type *)((long)this + 0x62) != None) {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
                    ZXing::ToString_abi_cxx11_((Error *)local_218);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)local_218._0_8_,local_218._8_8_);
                    if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
                      operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
                    }
                  }
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," \"",2);
                  ZXing::Result::text_abi_cxx11_((TextMode)local_218);
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,(char *)local_218._0_8_,local_218._8_8_
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
                  if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
                    operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
                  }
                }
                lVar16 = 1;
                pcVar13 = "\n";
              }
              else {
                if ((0x20 < (ulong)(local_148._8_8_ - local_148._0_8_)) ||
                   (1 < (ulong)(((long)(local_190._8_8_ - local_190._0_8_) >> 3) *
                               -0x7b425ed097b425ed))) {
                  if (main::firstFile == '\x01') {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1)
                    ;
                  }
                  if (0x20 < (ulong)(local_148._8_8_ - local_148._0_8_)) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"File:       ",0xc);
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,(local_1c0->_M_dataplus)._M_p,
                                         local_1c0->_M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                  }
                  main::firstFile = '\x01';
                }
                if (*(BarcodeFormat *)((long)this + 0xc0) != None) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Text:       \"",0xd);
                  ZXing::Result::text_abi_cxx11_();
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,(char *)local_1e8._0_8_,local_1e8._8_8_
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"\n",2);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Bytes:      ",0xc);
                  if ((local_1f4 & 0x1c0000) == 0x40000) {
                    ZXing::Result::bytesECI();
                  }
                  else {
                    __x = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          ZXing::Result::bytes();
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_168,
                               __x);
                  }
                  local_218._0_8_ = local_218 + 0x10;
                  local_50 = poVar11;
                  std::__cxx11::string::_M_construct
                            ((ulong)local_218,
                             ((char)local_168._8_8_ - (char)local_168._M_allocated_capacity) *
                             '\x03');
                  if (local_168._8_8_ != local_168._M_allocated_capacity) {
                    lVar16 = 0;
                    uVar15 = 0;
                    do {
                      snprintf((char *)(local_218._0_8_ + lVar16),4,"%02X ",
                               (ulong)*(byte *)(local_168._M_allocated_capacity + uVar15));
                      uVar15 = uVar15 + 1;
                      lVar16 = lVar16 + 3;
                    } while (uVar15 < (ulong)(local_168._8_8_ - local_168._0_8_));
                  }
                  std::__cxx11::string::substr((ulong)&local_1b0,(ulong)local_218);
                  poVar11 = local_50;
                  if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
                    operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
                  }
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar11,(char *)CONCAT44(iStack_1ac,local_1b0),
                                       (long)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Format:     ",0xc);
                  pbVar18 = (pointer)(local_1e8 + 0x10);
                  ZXing::ToString_abi_cxx11_((BarcodeFormat)local_218);
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar11,(char *)local_218._0_8_,local_218._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Identifier: ",0xc);
                  ZXing::Result::symbologyIdentifier_abi_cxx11_();
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar11,(char *)local_f8,local_f0);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Content:    ",0xc);
                  ZXing::Result::contentType();
                  ZXing::ToString_abi_cxx11_((ContentType)&local_98);
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar11,(char *)local_98,local_90);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"HasECI:     ",0xc);
                  ZXing::Result::hasECI();
                  poVar11 = std::ostream::_M_insert<bool>(SUB81(poVar11,0));
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Position:   ",0xc);
                  ZXing::ToString<int>(&local_b8,(Position *)((long)this + 0x68));
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar11,local_b8._M_dataplus._M_p,local_b8._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Rotation:   ",0xc);
                  iVar6 = ZXing::Result::orientation();
                  poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar6);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11," deg\n",5);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"IsMirrored: ",0xc);
                  poVar11 = std::ostream::_M_insert<bool>(SUB81(poVar11,0));
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"IsInverted: ",0xc);
                  poVar11 = std::ostream::_M_insert<bool>(SUB81(poVar11,0));
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                    operator_delete(local_b8._M_dataplus._M_p,
                                    local_b8.field_2._M_allocated_capacity + 1);
                  }
                  if (local_98 != local_88) {
                    operator_delete(local_98,local_88[0] + 1);
                  }
                  if (local_f8 != local_e8) {
                    operator_delete(local_f8,local_e8[0] + 1);
                  }
                  if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
                    operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(iStack_1ac,local_1b0) != &local_1a0) {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT44(iStack_1ac,local_1b0),
                                    local_1a0._M_allocated_capacity + 1);
                  }
                  if ((void *)local_168._M_allocated_capacity != (void *)0x0) {
                    operator_delete((void *)local_168._M_allocated_capacity,
                                    local_158 - local_168._0_8_);
                  }
                  if ((pointer)local_1e8._0_8_ != pbVar18) {
                    operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
                  }
                  ZXing::Result::ecLevel_abi_cxx11_();
                  if ((pointer)local_218._8_8_ != (pointer)0x0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"EC Level:   ",0xc);
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,(char *)local_218._0_8_,
                                         local_218._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                  }
                  if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
                    operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
                  }
                  ZXing::Result::version_abi_cxx11_();
                  if ((pointer)local_218._8_8_ != (pointer)0x0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Version:    ",0xc);
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,(char *)local_218._0_8_,
                                         local_218._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                  }
                  if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
                    operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
                  }
                  ZXing::ToString_abi_cxx11_((Error *)local_218);
                  if ((pointer)local_218._8_8_ != (pointer)0x0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Error:      ",0xc);
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,(char *)local_218._0_8_,
                                         local_218._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                  }
                  if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
                    operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
                  }
                  if (*(int *)((long)this + 0xcc) != 0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Lines:      ",0xc);
                    poVar11 = (ostream *)
                              std::ostream::operator<<
                                        ((ostream *)&std::cout,*(int *)((long)this + 0xcc));
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                  }
                  BVar2 = *(BarcodeFormat *)((long)this + 0xc0);
                  if (BVar2 == None || (BVar2 & ~(UPCE|UPCA|EAN13|EAN8)) != None) {
                    if ((BVar2 == ITF) &&
                       (piVar12 = (int *)ZXing::Result::bytes(), piVar12[2] - *piVar12 == 0xe)) {
                      ZXing::Result::text_abi_cxx11_();
                      ZXing::GTIN::LookupCountryIdentifier
                                ((string *)local_218,(BarcodeFormat)local_1e8);
                      if ((pointer)local_218._8_8_ != (pointer)0x0) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"Country:    ",0xc);
                        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,(char *)local_218._0_8_,
                                             local_218._8_8_);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                      }
                      goto LAB_0010adcd;
                    }
                  }
                  else {
                    ZXing::Result::text_abi_cxx11_();
                    ZXing::GTIN::LookupCountryIdentifier
                              ((string *)local_218,(BarcodeFormat)local_1e8);
                    if ((pointer)local_218._8_8_ != (pointer)0x0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"Country:    ",0xc);
                      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,(char *)local_218._0_8_,
                                           local_218._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                    }
                    if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
                      operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
                    }
                    if ((pointer)local_1e8._0_8_ != pbVar18) {
                      operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
                    }
                    ZXing::GTIN::EanAddOn_abi_cxx11_((Result *)local_218);
                    if ((pointer)local_218._8_8_ != (pointer)0x0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"Add-On:     ",0xc);
                      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,(char *)local_218._0_8_,
                                           local_218._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                    }
                    if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
                      operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
                    }
                    ZXing::GTIN::EanAddOn_abi_cxx11_((Result *)local_1e8);
                    ZXing::GTIN::Price((string *)local_218);
                    if ((pointer)local_218._8_8_ != (pointer)0x0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"Price:      ",0xc);
                      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,(char *)local_218._0_8_,
                                           local_218._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                    }
                    if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
                      operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
                    }
                    if ((pointer)local_1e8._0_8_ != pbVar18) {
                      operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
                    }
                    ZXing::GTIN::EanAddOn_abi_cxx11_((Result *)local_1e8);
                    ZXing::GTIN::IssueNr((string *)local_218);
                    if ((pointer)local_218._8_8_ != (pointer)0x0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"Issue #:    ",0xc);
                      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,(char *)local_218._0_8_,
                                           local_218._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                    }
LAB_0010adcd:
                    if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
                      operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
                    }
                    if ((pointer)local_1e8._0_8_ != pbVar18) {
                      operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
                    }
                  }
                  bVar5 = ZXing::Result::isPartOfSequence((Result *)this);
                  if (bVar5) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Structured Append: symbol ",0x1a);
                    iVar6 = ZXing::Result::sequenceIndex();
                    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6 + 1);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11," of ",4);
                    iVar6 = ZXing::Result::sequenceSize();
                    poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar6);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11," (parity/id: \'",0xe);
                    ZXing::Result::sequenceId_abi_cxx11_();
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar11,(char *)local_218._0_8_,local_218._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\')\n",3);
LAB_0010af30:
                    if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
                      operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
                    }
                  }
                  else {
                    iVar6 = ZXing::Result::sequenceSize();
                    if (0 < iVar6) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"Structured Append: merged result from ",0x26
                                );
                      iVar6 = ZXing::Result::sequenceSize();
                      poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11," symbols (parity/id: \'",0x16);
                      ZXing::Result::sequenceId_abi_cxx11_();
                      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar11,(char *)local_218._0_8_,local_218._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\')\n",3);
                      goto LAB_0010af30;
                    }
                  }
                  if (*(bool *)((long)this + 0xd2) == true) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Reader Initialisation/Programming\n",0x22);
                  }
                  goto LAB_0010a552;
                }
                lVar16 = 0x11;
                pcVar13 = "No barcode found\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,pcVar13,lVar16);
            }
LAB_0010a552:
            local_1e8._36_4_ = local_1e8._36_4_ | local_1f8;
            this = (PointT<int>)((long)this + 0xd8);
          } while (this != local_170);
        }
        if (((local_148._8_8_ - local_148._0_8_ & 0x1fffffffe0) == 0x20) && (local_128 != 0)) {
          stbi_write_png((char *)local_130,iStack_6c,local_68,3,(void *)local_78._0_8_,local_60);
        }
        pcVar13 = getenv("MEASURE_PERF");
        if (pcVar13 != (char *)0x0) {
          iVar6 = 1;
          iVar17 = 0;
          lVar16 = std::chrono::_V2::system_clock::now();
          do {
            iVar19 = iVar6;
            if (0 < iVar6) {
              do {
                ZXing::ReadBarcodes((ImageView *)&stack0xffffffffffffffb8,(ReaderOptions *)local_78)
                ;
                std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
                          ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)
                           &stack0xffffffffffffffb8);
                iVar19 = iVar19 + -1;
              } while (iVar19 != 0);
            }
            iVar17 = iVar17 + iVar6;
            lVar14 = std::chrono::_V2::system_clock::now();
            uVar15 = lVar14 - lVar16;
            iVar19 = iVar6 * 10;
            if (99999999 < (long)uVar15) {
              iVar19 = iVar6;
            }
            if (999 < iVar6) {
              iVar19 = iVar6;
            }
            iVar6 = iVar19;
          } while ((long)uVar15 < 1000000000);
          printf("time: %5.2f ms per frame\n",(double)(uVar15 / 1000000) / (double)iVar17);
        }
        std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
                  ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)local_190);
        pbVar18 = local_1c0;
      }
      if (local_178 == (PointT<int>)0x0) {
        local_1e8[0x24] = local_1b8.code;
        local_1e8[0x25] = local_1b8.modifier;
        local_1e8[0x26] = local_1b8.eciModifierOffset;
        local_1e8[0x27] = local_1b8.aiFlag;
        break;
      }
      free((void *)local_178);
      pbVar18 = pbVar18 + 1;
    } while (pbVar18 != local_58);
  }
  else {
    local_1e8._36_4_ = 0xffffffff;
    PrintUsage(*(char **)local_170);
  }
  std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector(&local_d8);
  if (local_130 != (string  [8])local_120) {
    operator_delete((void *)local_130,CONCAT71(local_120._1_7_,local_120[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_148);
  return local_1e8._36_4_;
}

Assistant:

int main(int argc, char* argv[])
{
	ReaderOptions options;
	CLI cli;
	Barcodes allBarcodes;
	int ret = 0;

	options.setTextMode(TextMode::HRI);
	options.setEanAddOnSymbol(EanAddOnSymbol::Read);

	if (!ParseOptions(argc, argv, options, cli)) {
		PrintUsage(argv[0]);
		return -1;
	}

	std::cout.setf(std::ios::boolalpha);

	for (const auto& filePath : cli.filePaths) {
		int width, height, channels;
		std::unique_ptr<stbi_uc, void (*)(void*)> buffer(stbi_load(filePath.c_str(), &width, &height, &channels, cli.forceChannels),
														 stbi_image_free);
		if (buffer == nullptr) {
			std::cerr << "Failed to read image: " << filePath << " (" << stbi_failure_reason() << ")" << "\n";
			return -1;
		}
		channels = cli.forceChannels ? cli.forceChannels : channels;

		auto ImageFormatFromChannels = std::array{ImageFormat::None, ImageFormat::Lum, ImageFormat::LumA, ImageFormat::RGB, ImageFormat::RGBA};
		ImageView image{buffer.get(), width, height, ImageFormatFromChannels.at(channels)};
		auto barcodes = ReadBarcodes(image.rotated(cli.rotate), options);

		// if we did not find anything, insert a dummy to produce some output for each file
		if (barcodes.empty())
			barcodes.emplace_back();

		allBarcodes.insert(allBarcodes.end(), barcodes.begin(), barcodes.end());
		if (filePath == cli.filePaths.back()) {
			auto merged = MergeStructuredAppendSequences(allBarcodes);
			// report all merged sequences as part of the last file to make the logic not overly complicated here
			barcodes.insert(barcodes.end(), std::make_move_iterator(merged.begin()), std::make_move_iterator(merged.end()));
		}

		for (auto&& barcode : barcodes) {

			if (!cli.outPath.empty())
				drawRect(image, barcode.position(), bool(barcode.error()));

			ret |= static_cast<int>(barcode.error().type());

			if (cli.bytesOnly) {
				std::cout.write(reinterpret_cast<const char*>(barcode.bytes().data()), barcode.bytes().size());
				continue;
			}

			if (cli.oneLine) {
				std::cout << filePath << " " << ToString(barcode.format());
				if (barcode.isValid())
					std::cout << " \"" << barcode.text(TextMode::Escaped) << "\"";
				else if (barcode.error())
					std::cout << " " << ToString(barcode.error());
				std::cout << "\n";
				continue;
			}

			if (cli.filePaths.size() > 1 || barcodes.size() > 1) {
				static bool firstFile = true;
				if (!firstFile)
					std::cout << "\n";
				if (cli.filePaths.size() > 1)
					std::cout << "File:       " << filePath << "\n";
				firstFile = false;
			}

			if (barcode.format() == BarcodeFormat::None) {
				std::cout << "No barcode found\n";
				continue;
			}

			std::cout << "Text:       \"" << barcode.text() << "\"\n"
					  << "Bytes:      " << ToHex(options.textMode() == TextMode::ECI ? barcode.bytesECI() : barcode.bytes()) << "\n"
					  << "Format:     " << ToString(barcode.format()) << "\n"
					  << "Identifier: " << barcode.symbologyIdentifier() << "\n"
					  << "Content:    " << ToString(barcode.contentType()) << "\n"
					  << "HasECI:     " << barcode.hasECI() << "\n"
					  << "Position:   " << ToString(barcode.position()) << "\n"
					  << "Rotation:   " << barcode.orientation() << " deg\n"
					  << "IsMirrored: " << barcode.isMirrored() << "\n"
					  << "IsInverted: " << barcode.isInverted() << "\n";

			auto printOptional = [](const char* key, const std::string& v) {
				if (!v.empty())
					std::cout << key << v << "\n";
			};

			printOptional("EC Level:   ", barcode.ecLevel());
			printOptional("Version:    ", barcode.version());
			printOptional("Error:      ", ToString(barcode.error()));

			if (barcode.lineCount())
				std::cout << "Lines:      " << barcode.lineCount() << "\n";

			if ((BarcodeFormat::EAN13 | BarcodeFormat::EAN8 | BarcodeFormat::UPCA | BarcodeFormat::UPCE)
					.testFlag(barcode.format())) {
				printOptional("Country:    ", GTIN::LookupCountryIdentifier(barcode.text(), barcode.format()));
				printOptional("Add-On:     ", GTIN::EanAddOn(barcode));
				printOptional("Price:      ", GTIN::Price(GTIN::EanAddOn(barcode)));
				printOptional("Issue #:    ", GTIN::IssueNr(GTIN::EanAddOn(barcode)));
			} else if (barcode.format() == BarcodeFormat::ITF && Size(barcode.bytes()) == 14) {
				printOptional("Country:    ", GTIN::LookupCountryIdentifier(barcode.text(), barcode.format()));
			}

			if (barcode.isPartOfSequence())
				std::cout << "Structured Append: symbol " << barcode.sequenceIndex() + 1 << " of "
						  << barcode.sequenceSize() << " (parity/id: '" << barcode.sequenceId() << "')\n";
			else if (barcode.sequenceSize() > 0)
				std::cout << "Structured Append: merged result from " << barcode.sequenceSize() << " symbols (parity/id: '"
						  << barcode.sequenceId() << "')\n";

			if (barcode.readerInit())
				std::cout << "Reader Initialisation/Programming\n";

#ifdef ZXING_EXPERIMENTAL_API
			if (cli.showSymbol && barcode.symbol().data())
				std::cout << "Symbol:\n" << WriteBarcodeToUtf8(barcode);
#endif
		}

		if (Size(cli.filePaths) == 1 && !cli.outPath.empty())
			stbi_write_png(cli.outPath.c_str(), image.width(), image.height(), 3, image.data(), image.rowStride());

#ifdef NDEBUG
		if (getenv("MEASURE_PERF")) {
			auto startTime = std::chrono::high_resolution_clock::now();
			auto duration = startTime - startTime;
			int N = 0;
			int blockSize = 1;
			do {
				for (int i = 0; i < blockSize; ++i)
					ReadBarcodes(image, options);
				N += blockSize;
				duration = std::chrono::high_resolution_clock::now() - startTime;
				if (blockSize < 1000 && duration < std::chrono::milliseconds(100))
					blockSize *= 10;
			} while (duration < std::chrono::seconds(1));
			printf("time: %5.2f ms per frame\n", double(std::chrono::duration_cast<std::chrono::milliseconds>(duration).count()) / N);
		}
#endif
	}

	return ret;
}